

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O2

void __thiscall SQClassMember::Null(SQClassMember *this)

{
  SQObjectPtr::Null(&this->val);
  SQObjectPtr::Null(&this->attrs);
  return;
}

Assistant:

void Null() {
        val.Null();
        attrs.Null();
    }